

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecursiveDescentParser.cpp
# Opt level: O0

shared_ptr<MyCompiler::Factor> __thiscall
MyCompiler::RecursiveDescentParser::parse<MyCompiler::Factor>(RecursiveDescentParser *this)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  RecursiveDescentParser *in_RSI;
  shared_ptr<MyCompiler::Factor> sVar7;
  shared_ptr<MyCompiler::Expression> local_c0;
  allocator local_a9;
  string local_a8 [32];
  undefined1 local_88 [24];
  string local_70 [32];
  undefined1 local_50 [32];
  undefined1 local_30 [32];
  RecursiveDescentParser *this_local;
  shared_ptr<MyCompiler::Factor> *pResult;
  
  local_30[0x17] = 0;
  this_local = this;
  std::make_shared<MyCompiler::Factor>();
  if (in_RSI->sym == IDENT) {
    peVar2 = std::__shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    (peVar2->super_AbstractAstNode).caseNum = 0;
    parse<MyCompiler::Ident>((RecursiveDescentParser *)local_30);
    peVar2 = std::__shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    std::shared_ptr<MyCompiler::Ident>::operator=
              (&peVar2->pIdent,(shared_ptr<MyCompiler::Ident> *)local_30);
    std::shared_ptr<MyCompiler::Ident>::~shared_ptr((shared_ptr<MyCompiler::Ident> *)local_30);
    _Var6._M_pi = extraout_RDX;
  }
  else if (in_RSI->sym == NUMBER) {
    peVar2 = std::__shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    (peVar2->super_AbstractAstNode).caseNum = 1;
    parse<MyCompiler::Number>((RecursiveDescentParser *)local_50);
    peVar2 = std::__shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    std::shared_ptr<MyCompiler::Number>::operator=
              (&peVar2->pNumber,(shared_ptr<MyCompiler::Number> *)local_50);
    std::shared_ptr<MyCompiler::Number>::~shared_ptr((shared_ptr<MyCompiler::Number> *)local_50);
    _Var6._M_pi = extraout_RDX_00;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"expression expected",(allocator *)(local_88 + 0x17));
    except(in_RSI,LPAREN,(string *)local_70);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)(local_88 + 0x17));
    peVar2 = std::__shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    (peVar2->super_AbstractAstNode).caseNum = 2;
    parse<MyCompiler::Expression>((RecursiveDescentParser *)local_88);
    peVar2 = std::__shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    std::shared_ptr<MyCompiler::Expression>::operator=
              (&peVar2->pExpression,(shared_ptr<MyCompiler::Expression> *)local_88);
    std::shared_ptr<MyCompiler::Expression>::~shared_ptr
              ((shared_ptr<MyCompiler::Expression> *)local_88);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,"right parenthesis expected",&local_a9);
    except(in_RSI,RPAREN,(string *)local_a8);
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    peVar2 = std::__shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    peVar3 = std::
             __shared_ptr_access<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&peVar2->pExpression);
    bVar1 = std::operator==(&peVar3->pAddSubOp,(nullptr_t)0x0);
    _Var6._M_pi = extraout_RDX_01;
    if (bVar1) {
      peVar2 = std::
               __shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      peVar3 = std::
               __shared_ptr_access<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&peVar2->pExpression);
      bVar1 = std::
              vector<std::pair<MyCompiler::AddSubOp,_MyCompiler::Term>,_std::allocator<std::pair<MyCompiler::AddSubOp,_MyCompiler::Term>_>_>
              ::empty(&peVar3->vAddSubOpExpression);
      _Var6._M_pi = extraout_RDX_02;
      if (bVar1) {
        peVar2 = std::
                 __shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
        peVar3 = std::
                 __shared_ptr_access<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&peVar2->pExpression);
        peVar4 = std::
                 __shared_ptr_access<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&peVar3->pTerm);
        peVar2 = std::
                 __shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&peVar4->pFactor);
        _Var6._M_pi = extraout_RDX_03;
        if ((peVar2->super_AbstractAstNode).caseNum == 1) {
          peVar2 = std::
                   __shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)this);
          peVar3 = std::
                   __shared_ptr_access<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&peVar2->pExpression);
          peVar4 = std::
                   __shared_ptr_access<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&peVar3->pTerm);
          bVar1 = std::
                  vector<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>,_std::allocator<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>_>_>
                  ::empty(&peVar4->vMulDivOpFactor);
          _Var6._M_pi = extraout_RDX_04;
          if (bVar1) {
            peVar2 = std::
                     __shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)this);
            (peVar2->super_AbstractAstNode).caseNum = 1;
            peVar2 = std::
                     __shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)this);
            peVar3 = std::
                     __shared_ptr_access<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&peVar2->pExpression);
            peVar4 = std::
                     __shared_ptr_access<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&peVar3->pTerm);
            peVar2 = std::
                     __shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&peVar4->pFactor);
            peVar5 = std::
                     __shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)this);
            std::shared_ptr<MyCompiler::Number>::operator=(&peVar5->pNumber,&peVar2->pNumber);
            std::shared_ptr<MyCompiler::Expression>::shared_ptr(&local_c0,(nullptr_t)0x0);
            peVar2 = std::
                     __shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)this);
            std::shared_ptr<MyCompiler::Expression>::operator=(&peVar2->pExpression,&local_c0);
            std::shared_ptr<MyCompiler::Expression>::~shared_ptr(&local_c0);
            _Var6._M_pi = extraout_RDX_05;
          }
        }
      }
    }
  }
  sVar7.super___shared_ptr<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var6._M_pi;
  sVar7.super___shared_ptr<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<MyCompiler::Factor>)
         sVar7.super___shared_ptr<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<MyCompiler::Factor> MyCompiler::RecursiveDescentParser::parse()
{
    auto pResult = std::make_shared<Factor>();

    if (sym == SymbolType::IDENT)
    {
        pResult->caseNum = 0;
        pResult->pIdent = parse<Ident>();
    }
    else if (sym == SymbolType::NUMBER)
    {
        pResult->caseNum = 1;
        pResult->pNumber = parse<Number>();
    }
    else
    {
        except(SymbolType::LPAREN, "expression expected");
        pResult->caseNum = 2;
        pResult->pExpression = parse<Expression>();
        except(SymbolType::RPAREN, "right parenthesis expected");
        if (pResult->pExpression->pAddSubOp == nullptr && pResult->pExpression->vAddSubOpExpression.empty() &&
            pResult->pExpression->pTerm->pFactor->caseNum == 1 && pResult->pExpression->pTerm->vMulDivOpFactor.empty())
        {
            pResult->caseNum = 1;
            pResult->pNumber = pResult->pExpression->pTerm->pFactor->pNumber;
            pResult->pExpression = nullptr;
        }
    }

    return pResult;
}